

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O1

int __thiscall
deqp::egl::anon_unknown_3::CreateContextExtCase::init(CreateContextExtCase *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  EGLDisplay pvVar2;
  Library *egl;
  vector<void_*,_std::allocator<void_*>_> local_28;
  
  pvVar2 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_display = pvVar2;
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  eglu::chooseConfigs(&local_28,egl,this->m_display,&this->m_filter);
  std::vector<void_*,_std::allocator<void_*>_>::_M_move_assign(&this->m_configs,&local_28);
  iVar1 = extraout_EAX;
  if (local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

void CreateContextExtCase::init (void)
{
	m_display	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_configs	= eglu::chooseConfigs(m_eglTestCtx.getLibrary(), m_display, m_filter);
}